

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTriangleTorus.h
# Opt level: O2

void __thiscall
pzgeom::TPZTriangleTorus::X<Fad<double>>
          (TPZTriangleTorus *this,TPZFMatrix<double> *coord,TPZVec<Fad<double>_> *loc,
          TPZVec<Fad<double>_> *result)

{
  REAL RVar1;
  REAL RVar2;
  undefined1 local_e8 [24];
  double *pdStack_d0;
  FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>
  local_c0;
  TPZVec<Fad<double>_> toro;
  undefined1 local_80 [24];
  FadExpr<FadFuncSin<Fad<double>_>_> *local_68;
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_> local_58;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>
  local_38;
  
  TPZGeoTriangle::X<Fad<double>>(&(this->fPhiTheta).super_TPZFMatrix<double>,loc,result);
  local_e8._0_8_ = 0.0;
  local_e8._8_4_ = 0;
  local_e8._16_8_ = (double *)0x0;
  pdStack_d0 = (double *)0x0;
  TPZVec<Fad<double>_>::TPZVec(&toro,3,(Fad<double> *)local_e8);
  Fad<double>::~Fad((Fad<double> *)local_e8);
  RVar1 = this->fR;
  RVar2 = this->fr;
  cos<double>((FadExpr<FadFuncCos<Fad<double>_>_> *)local_e8,result->fStore);
  local_58.fadexpr_.left_.defaultVal = 0.0;
  local_c0.fadexpr_.left_.defaultVal = 0.0;
  local_c0.fadexpr_.left_.constant_ = RVar1;
  local_c0.fadexpr_.right_ = &local_58;
  local_58.fadexpr_.left_.constant_ = RVar2;
  local_58.fadexpr_.right_ = (FadExpr<FadFuncCos<Fad<double>_>_> *)local_e8;
  cos<double>((FadExpr<FadFuncCos<Fad<double>_>_> *)local_80,result->fStore + 1);
  local_38.fadexpr_.left_ = &local_c0;
  local_38.fadexpr_.right_ = (FadExpr<FadFuncCos<Fad<double>_>_> *)local_80;
  Fad<double>::operator=(toro.fStore,&local_38);
  Fad<double>::~Fad((Fad<double> *)(local_80 + 8));
  Fad<double>::~Fad((Fad<double> *)(local_e8 + 8));
  RVar1 = this->fR;
  RVar2 = this->fr;
  cos<double>((FadExpr<FadFuncCos<Fad<double>_>_> *)local_e8,result->fStore);
  local_58.fadexpr_.left_.defaultVal = 0.0;
  local_c0.fadexpr_.left_.defaultVal = 0.0;
  local_c0.fadexpr_.left_.constant_ = RVar1;
  local_c0.fadexpr_.right_ = &local_58;
  local_58.fadexpr_.left_.constant_ = RVar2;
  local_58.fadexpr_.right_ = (FadExpr<FadFuncCos<Fad<double>_>_> *)local_e8;
  sin<double>((FadExpr<FadFuncSin<Fad<double>_>_> *)local_80,result->fStore + 1);
  local_38.fadexpr_.left_ = &local_c0;
  local_38.fadexpr_.right_ = (FadExpr<FadFuncCos<Fad<double>_>_> *)local_80;
  Fad<double>::operator=
            (toro.fStore + 1,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>
              *)&local_38);
  Fad<double>::~Fad((Fad<double> *)(local_80 + 8));
  Fad<double>::~Fad((Fad<double> *)(local_e8 + 8));
  RVar1 = this->fr;
  sin<double>((FadExpr<FadFuncSin<Fad<double>_>_> *)local_e8,result->fStore);
  local_80._16_8_ = 0.0;
  local_80._8_8_ = RVar1;
  local_68 = (FadExpr<FadFuncSin<Fad<double>_>_> *)local_e8;
  Fad<double>::operator=
            (toro.fStore + 2,
             (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_> *)local_80
            );
  Fad<double>::~Fad((Fad<double> *)(local_e8 + 8));
  TPZVec<Fad<double>_>::operator=(result,&toro);
  TPZVec<Fad<double>_>::~TPZVec(&toro);
  return;
}

Assistant:

void X(TPZFMatrix<REAL> &coord,TPZVec<T> &loc,TPZVec<T> &result) const
        {
            TPZGeoTriangle::X(this->fPhiTheta,loc,result);
            TPZVec <T> toro(3,0.0);
            
            toro[0] = (fR + fr*cos(result[0]))*cos(result[1]);
            toro[1] = (fR + fr*cos(result[0]))*sin(result[1]);
            toro[2] = fr*sin(result[0]);		
            result=toro;
        }